

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringVectorAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::
TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::writeValueTo(TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *this,OStream *os,int version)

{
  size_type sVar1;
  const_reference pvVar2;
  OStream *in_RSI;
  long in_RDI;
  int strSize;
  int i;
  int size;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  OStream *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8));
  for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8),(long)local_1c);
    std::__cxx11::string::size();
    Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = in_RSI;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 8),(long)local_1c);
    std::__cxx11::string::operator[]((ulong)pvVar2);
    Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  return;
}

Assistant:

IMF_EXPORT void
StringVectorAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    int size = _value.size ();

    for (int i = 0; i < size; i++)
    {
        int strSize = _value[i].size ();
        Xdr::write<StreamIO> (os, strSize);
        Xdr::write<StreamIO> (os, &_value[i][0], strSize);
    }
}